

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param_bin(Net *this,FILE *fp)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer plVar1;
  layer_creator_func p_Var2;
  pointer pBVar3;
  iterator __position;
  int *piVar4;
  void *__ptr;
  long *plVar5;
  Net *pNVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  Layer *pLVar11;
  ulong uVar12;
  long lVar13;
  int typeindex;
  int bottom_blob_index;
  int bottom_count;
  int top_count;
  int layer_count;
  int blob_count;
  int magic;
  ParamDict pd;
  uint local_610;
  int local_60c;
  int local_608;
  int local_604;
  int local_600;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  Net *local_5f0;
  Layer *local_5e8;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_5e0;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_5d8;
  ParamDict local_5d0;
  
  local_5f4 = 0;
  bVar7 = readValue<int>(&local_5f4,fp);
  iVar10 = -1;
  if (bVar7) {
    if (local_5f4 == 0x7685dd) {
      local_5fc = 0;
      bVar7 = readValue<int>(&local_5fc,fp);
      iVar10 = -1;
      if (bVar7) {
        local_5f8 = 0;
        bVar7 = readValue<int>(&local_5f8,fp);
        iVar10 = -1;
        if (bVar7) {
          local_5d8 = &this->layers;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                    (local_5d8,(long)local_5fc);
          local_5e0 = &this->blobs;
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(local_5e0,(long)local_5f8);
          ParamDict::ParamDict(&local_5d0);
          local_60c = 0;
          bVar7 = 0 < local_5fc;
          pNVar6 = this;
          if (0 < local_5fc) {
            do {
              local_5f0 = pNVar6;
              bVar8 = readValue<int>((int *)&local_610,fp);
              uVar12 = 1;
              if (bVar8) {
                bVar8 = readValue<int>(&local_604,fp);
                uVar12 = 1;
                if (bVar8) {
                  bVar8 = readValue<int>(&local_600,fp);
                  uVar12 = 1;
                  if (bVar8) {
                    pLVar11 = create_layer(local_610);
                    if (pLVar11 == (Layer *)0x0) {
                      if ((int)local_610 < 0) {
LAB_0011c746:
                        pLVar11 = (Layer *)0x0;
                      }
                      else {
                        plVar1 = (local_5f0->custom_layer_registry).
                                 super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        pLVar11 = (Layer *)0x0;
                        if ((int)(local_610 & 0xfffffeff) <
                            (int)((ulong)((long)(local_5f0->custom_layer_registry).
                                                super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)plVar1) >> 4)) {
                          p_Var2 = plVar1[local_610 & 0xfffffeff].creator;
                          if (p_Var2 == (layer_creator_func)0x0) goto LAB_0011c746;
                          pLVar11 = (*p_Var2)();
                        }
                      }
                    }
                    if (pLVar11 == (Layer *)0x0) {
                      fprintf(_stderr,"layer %d not exists or registered\n",(ulong)local_610);
                      clear(local_5f0);
                    }
                    else {
                      local_5e8 = pLVar11;
                      std::vector<int,_std::allocator<int>_>::resize
                                (&pLVar11->bottoms,(long)local_604);
                      bVar8 = 0 < local_604;
                      uVar12 = 5;
                      if (0 < local_604) {
                        lVar13 = 0;
                        do {
                          bVar9 = readValue<int>(&local_608,fp);
                          if (!bVar9) {
LAB_0011c7f9:
                            uVar12 = 1;
                            break;
                          }
                          pBVar3 = (local_5e0->
                                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                   _M_impl.super__Vector_impl_data._M_start;
                          __position._M_current =
                               pBVar3[local_608].consumers.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              pBVar3[local_608].consumers.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)
                                       &pBVar3[local_608].consumers,__position,&local_60c);
                          }
                          else {
                            *__position._M_current = local_60c;
                            pBVar3[local_608].consumers.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish = __position._M_current + 1;
                          }
                          (pLVar11->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar13] = local_608;
                          if (!bVar9) goto LAB_0011c7f9;
                          lVar13 = lVar13 + 1;
                          bVar8 = lVar13 < local_604;
                        } while (lVar13 < local_604);
                      }
                      if (!bVar8) {
                        this_00 = &local_5e8->tops;
                        std::vector<int,_std::allocator<int>_>::resize(this_00,(long)local_600);
                        bVar8 = 0 < local_600;
                        uVar12 = 8;
                        if (0 < local_600) {
                          lVar13 = 0;
                          do {
                            bVar9 = readValue<int>(&local_608,fp);
                            if (!bVar9) {
                              uVar12 = 1;
                              break;
                            }
                            (local_5e0->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)
                            ._M_impl.super__Vector_impl_data._M_start[local_608].producer =
                                 local_60c;
                            (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar13] = local_608;
                            lVar13 = lVar13 + 1;
                            bVar8 = lVar13 < local_600;
                          } while (lVar13 < local_600);
                        }
                        if (!bVar8) {
                          iVar10 = ParamDict::load_param_bin(&local_5d0,fp);
                          pLVar11 = local_5e8;
                          if (iVar10 == 0) {
                            iVar10 = (*local_5e8->_vptr_Layer[2])(local_5e8,&local_5d0);
                            if (iVar10 == 0) {
                              (local_5d8->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[local_60c] = pLVar11;
                              uVar12 = 0;
                              goto LAB_0011c919;
                            }
                            load_param_bin();
                          }
                          else {
                            load_param_bin();
                          }
                          uVar12 = 0;
                        }
                      }
                    }
                  }
                }
              }
LAB_0011c919:
              if ((uVar12 & 0xb) != 0) break;
              local_60c = local_60c + 1;
              bVar7 = local_60c < local_5fc;
              pNVar6 = local_5f0;
            } while (local_60c < local_5fc);
          }
          iVar10 = -(uint)bVar7;
          lVar13 = 0x560;
          do {
            piVar4 = *(int **)((long)&local_5d0.params[0].v.data + lVar13);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                __ptr = *(void **)((long)&local_5d0.params[0].loaded + lVar13);
                plVar5 = *(long **)((long)&local_5d0.params[0].v.packing + lVar13);
                if (plVar5 == (long *)0x0) {
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                }
                else {
                  (**(code **)(*plVar5 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar13 + 4) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar13 + 4) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar13) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar13) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar13) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar13) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar13) = 0;
            lVar13 = lVar13 + -0x48;
          } while (lVar13 != -0x40);
        }
      }
    }
    else {
      load_param_bin();
    }
  }
  return iVar10;
}

Assistant:

int Net::load_param_bin(FILE* fp)
{
    int magic = 0;
    if (!readValue(magic, fp))
        return -1;
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    if (!readValue(layer_count, fp))
        return -1;

    int blob_count = 0;
    if (!readValue(blob_count, fp))
        return -1;

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (use_vulkan_compute && !vkdev)
    {
        // use default vulkan device
        if (!vkdev_local)
            vkdev_local = new VulkanDevice;
        vkdev = vkdev_local;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        if (!readValue(typeindex, fp))
            return -1;

        int bottom_count;
        if (!readValue(bottom_count, fp))
            return -1;

        int top_count;
        if (!readValue(top_count, fp))
            return -1;

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            if (!readValue(bottom_blob_index, fp))
                return -1;

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            if (!readValue(top_blob_index, fp))
                return -1;

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(fp);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

    return 0;
}